

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkTransferNameIds(Abc_Ntk_t *p,Abc_Ntk_t *pNew)

{
  int iVar1;
  uint i_00;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Abc_Ntk_t *pAVar5;
  int local_2c;
  int i;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNew_local;
  Abc_Ntk_t *p_local;
  
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2d8,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->vNameIds == (Vec_Int_t *)0x0) {
    iVar1 = Abc_NtkObjNumMax(pNew);
    pVVar4 = Vec_IntStart(iVar1);
    pNew->vNameIds = pVVar4;
    local_2c = 0;
    do {
      iVar1 = Vec_PtrSize(p->vObjs);
      if (iVar1 <= local_2c) {
        return;
      }
      pObj_00 = Abc_NtkObj(p,local_2c);
      if ((((pObj_00 != (Abc_Obj_t *)0x0) && ((pObj_00->field_6).pTemp != (void *)0x0)) &&
          (iVar1 = Vec_IntSize(p->vNameIds), local_2c < iVar1)) &&
         (iVar1 = Vec_IntEntry(p->vNameIds,local_2c), iVar1 != 0)) {
        pObj_01 = Abc_ObjRegular((pObj_00->field_6).pCopy);
        pAVar5 = Abc_ObjNtk(pObj_01);
        if (pAVar5 != pNew) {
          __assert_fail("Abc_ObjNtk(pObjNew) == pNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                        ,0x2e2,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        iVar1 = Abc_ObjIsCi(pObj_01);
        if ((iVar1 == 0) || (iVar1 = Abc_ObjIsCi(pObj_00), iVar1 != 0)) {
          pVVar4 = pNew->vNameIds;
          i_00 = Abc_ObjId(pObj_01);
          uVar2 = Vec_IntEntry(p->vNameIds,local_2c);
          uVar3 = Abc_ObjIsComplement((pObj_00->field_6).pCopy);
          Vec_IntWriteEntry(pVVar4,i_00,uVar2 ^ uVar3);
        }
      }
      local_2c = local_2c + 1;
    } while( true );
  }
  __assert_fail("pNew->vNameIds == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                ,0x2d9,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferNameIds( Abc_Ntk_t * p, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->vNameIds != NULL );
    assert( pNew->vNameIds == NULL );
    pNew->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(pNew) );
//    Abc_NtkForEachCi( p, pObj, i )
//        printf( "%d ", Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) );
//    printf( "\n" );
    Abc_NtkForEachObj( p, pObj, i )
        if ( pObj->pCopy && i < Vec_IntSize(p->vNameIds) && Vec_IntEntry(p->vNameIds, i) )
        {
            pObjNew = Abc_ObjRegular(pObj->pCopy);
            assert( Abc_ObjNtk(pObjNew) == pNew );
            if ( Abc_ObjIsCi(pObjNew) && !Abc_ObjIsCi(pObj) ) // do not overwrite CI name by internal node name
                continue;
            Vec_IntWriteEntry( pNew->vNameIds, Abc_ObjId(pObjNew), Vec_IntEntry(p->vNameIds, i) ^ Abc_ObjIsComplement(pObj->pCopy) );
        }
}